

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O1

void __thiscall
TPZCompElWithMem<TPZMultiphysicsCompEl<pzgeom::TPZGeoPoint>_>::SetFreeIntPtIndices
          (TPZCompElWithMem<TPZMultiphysicsCompEl<pzgeom::TPZGeoPoint>_> *this)

{
  long lVar1;
  TPZMaterial *pTVar2;
  long *plVar3;
  long lVar4;
  
  pTVar2 = TPZCompEl::Material((TPZCompEl *)this);
  if (pTVar2 == (TPZMaterial *)0x0) {
    plVar3 = (long *)0x0;
  }
  else {
    plVar3 = (long *)__dynamic_cast(pTVar2,&TPZMaterial::typeinfo,&TPZMatWithMemBase::typeinfo,
                                    0xfffffffffffffffe);
  }
  if ((plVar3 != (long *)0x0) &&
     (lVar1 = (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fNElements,
     0 < lVar1)) {
    lVar4 = 0;
    do {
      (**(code **)(*plVar3 + 0x60))(plVar3);
      lVar4 = lVar4 + 1;
    } while (lVar1 != lVar4);
  }
  TPZManVector<long,_128>::Resize(&(this->fIntPtIndices).super_TPZManVector<long,_128>,0);
  return;
}

Assistant:

inline void TPZCompElWithMem<TBASE>::SetFreeIntPtIndices() {
    
    TPZMaterial * material = TBASE::Material();
    auto * matWithMem =
        dynamic_cast<TPZMatWithMemBase *>(material);
    if (matWithMem) {
        int64_t n = fIntPtIndices.NElements();
        
        for (int64_t i = 0; i < n; i++) {
            matWithMem->FreeMemItem(fIntPtIndices[i]);
        }
    }
    fIntPtIndices.Resize(0);
}